

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::TileBufferTask::~TileBufferTask(TileBufferTask *this)

{
  TileBufferTask *in_RDI;
  
  ~TileBufferTask(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

~TileBufferTask () override
        {
            _tile_group->push (_tile);
        }